

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  i16 iVar1;
  Table *pTVar2;
  int *piVar3;
  SrcList_item *pSVar4;
  char *pcVar5;
  Select *pSVar6;
  Expr *pEVar7;
  IdList *pIVar8;
  int local_58;
  Table *pTab;
  SrcList_item *pOldItem;
  SrcList_item *pNewItem;
  int nByte;
  int i;
  SrcList *pNew;
  int flags_local;
  SrcList *p_local;
  sqlite3 *db_local;
  
  if (p == (SrcList *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    if (p->nSrc < 1) {
      local_58 = 0;
    }
    else {
      local_58 = (p->nSrc + -1) * 0x68;
    }
    db_local = (sqlite3 *)sqlite3DbMallocRaw(db,local_58 + 0x70);
    if (db_local == (sqlite3 *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      iVar1 = p->nSrc;
      *(i16 *)((long)&db_local->pVfs + 2) = iVar1;
      *(i16 *)&db_local->pVfs = iVar1;
      for (pNewItem._4_4_ = 0; pNewItem._4_4_ < p->nSrc; pNewItem._4_4_ = pNewItem._4_4_ + 1) {
        piVar3 = db_local->aLimit + (long)pNewItem._4_4_ * 0x1a + -0x18;
        pSVar4 = p->a + pNewItem._4_4_;
        *(Schema **)piVar3 = pSVar4->pSchema;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zDatabase);
        *(char **)(piVar3 + 2) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zName);
        *(char **)(piVar3 + 4) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zAlias);
        *(char **)(piVar3 + 6) = pcVar5;
        *(u8 *)(piVar3 + 0xe) = pSVar4->jointype;
        piVar3[0xf] = pSVar4->iCursor;
        piVar3[0xc] = pSVar4->addrFillSub;
        piVar3[0xd] = pSVar4->regReturn;
        *(byte *)((long)piVar3 + 0x39) =
             *(byte *)((long)piVar3 + 0x39) & 0xfd | ((byte)pSVar4->field_0x39 >> 1 & 1) << 1;
        *(byte *)((long)piVar3 + 0x39) =
             *(byte *)((long)piVar3 + 0x39) & 0xfb | ((byte)pSVar4->field_0x39 >> 2 & 1) << 2;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zIndex);
        *(char **)(piVar3 + 0x16) = pcVar5;
        *(byte *)((long)piVar3 + 0x39) =
             *(byte *)((long)piVar3 + 0x39) & 0xfe | pSVar4->field_0x39 & 1;
        *(Index **)(piVar3 + 0x18) = pSVar4->pIndex;
        pTVar2 = pSVar4->pTab;
        *(Table **)(piVar3 + 8) = pTVar2;
        if (pTVar2 != (Table *)0x0) {
          pTVar2->nRef = pTVar2->nRef + 1;
        }
        pSVar6 = sqlite3SelectDup(db,pSVar4->pSelect,flags);
        *(Select **)(piVar3 + 10) = pSVar6;
        pEVar7 = sqlite3ExprDup(db,pSVar4->pOn,flags);
        *(Expr **)(piVar3 + 0x10) = pEVar7;
        pIVar8 = sqlite3IdListDup(db,pSVar4->pUsing);
        *(IdList **)(piVar3 + 0x12) = pIVar8;
        *(_func_void_void_ptr_char_ptr **)(piVar3 + 0x14) =
             (_func_void_void_ptr_char_ptr *)pSVar4->colUsed;
      }
    }
  }
  return (SrcList *)db_local;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRaw(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    struct SrcList_item *pNewItem = &pNew->a[i];
    struct SrcList_item *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->pSchema = pOldItem->pSchema;
    pNewItem->zDatabase = sqlite3DbStrDup(db, pOldItem->zDatabase);
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->jointype = pOldItem->jointype;
    pNewItem->iCursor = pOldItem->iCursor;
    pNewItem->addrFillSub = pOldItem->addrFillSub;
    pNewItem->regReturn = pOldItem->regReturn;
    pNewItem->isCorrelated = pOldItem->isCorrelated;
    pNewItem->viaCoroutine = pOldItem->viaCoroutine;
    pNewItem->zIndex = sqlite3DbStrDup(db, pOldItem->zIndex);
    pNewItem->notIndexed = pOldItem->notIndexed;
    pNewItem->pIndex = pOldItem->pIndex;
    pTab = pNewItem->pTab = pOldItem->pTab;
    if( pTab ){
      pTab->nRef++;
    }
    pNewItem->pSelect = sqlite3SelectDup(db, pOldItem->pSelect, flags);
    pNewItem->pOn = sqlite3ExprDup(db, pOldItem->pOn, flags);
    pNewItem->pUsing = sqlite3IdListDup(db, pOldItem->pUsing);
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}